

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_mod(lysc_ctx *ctx)

{
  lys_module *plVar1;
  lyd_node *plVar2;
  char *pcVar3;
  undefined8 local_70;
  char *local_58;
  uint local_34;
  uint32_t i;
  lys_module *orig_mod;
  lysc_deviation *dev;
  lysc_augment *aug;
  lysc_ctx *ctx_local;
  
  plVar1 = ctx->cur_mod;
  for (local_34 = 0; local_34 < (ctx->augs).count; local_34 = local_34 + 1) {
    plVar2 = (ctx->augs).field_2.dnodes[local_34];
    ctx->cur_mod = *(lys_module **)plVar2->schema;
    if (plVar2->next != (lyd_node *)0x0) {
      lysc_update_path(ctx,(lys_module *)0x0,"{extension}");
      lysc_update_path(ctx,(lys_module *)0x0,*(char **)plVar2->next);
    }
    lysc_update_path(ctx,(lys_module *)0x0,"{augment}");
    lysc_update_path(ctx,(lys_module *)0x0,(char *)**(undefined8 **)plVar2);
    pcVar3 = "";
    if (plVar2->next != (lyd_node *)0x0) {
      pcVar3 = " extension";
    }
    if ((*(byte *)((long)&plVar2->schema[1].name + 1) >> 1 & 1) == 0) {
      local_58 = *(char **)(*(long *)plVar2->schema + 8);
    }
    else {
      local_58 = plVar2->schema[1].dsc;
    }
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
            "Augment%s target node \"%s\" from module \"%s\" was not found.",pcVar3,
            **(undefined8 **)plVar2,local_58);
    ctx->cur_mod = plVar1;
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    if (plVar2->next != (lyd_node *)0x0) {
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    }
  }
  if ((ctx->augs).count == 0) {
    for (local_34 = 0; local_34 < (ctx->devs).count; local_34 = local_34 + 1) {
      plVar2 = (ctx->devs).field_2.dnodes[local_34];
      lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
      lysc_update_path(ctx,(lys_module *)0x0,(char *)**(undefined8 **)plVar2);
      if ((*(byte *)(*(long *)&plVar2->parent->field_0 + 0x79) >> 1 & 1) == 0) {
        local_70 = *(undefined8 *)(**(long **)&plVar2->parent->field_0 + 8);
      }
      else {
        local_70 = *(undefined8 *)(*(long *)&plVar2->parent->field_0 + 0x80);
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Deviation(s) target node \"%s\" from module \"%s\" was not found.",
              **(undefined8 **)plVar2,local_70);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    }
    if ((ctx->devs).count == 0) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ctx_local._4_4_ = LY_ENOTFOUND;
    }
  }
  else {
    ctx_local._4_4_ = LY_ENOTFOUND;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_unres_mod(struct lysc_ctx *ctx)
{
    struct lysc_augment *aug;
    struct lysc_deviation *dev;
    struct lys_module *orig_mod = ctx->cur_mod;
    uint32_t i;

    /* check that all augments were applied */
    for (i = 0; i < ctx->augs.count; ++i) {
        aug = ctx->augs.objs[i];
        ctx->cur_mod = aug->aug_pmod->mod;
        if (aug->ext) {
            lysc_update_path(ctx, NULL, "{extension}");
            lysc_update_path(ctx, NULL, aug->ext->name);
        }
        lysc_update_path(ctx, NULL, "{augment}");
        lysc_update_path(ctx, NULL, aug->nodeid->str);
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Augment%s target node \"%s\" from module \"%s\" was not found.",
                aug->ext ? " extension" : "", aug->nodeid->str, LYSP_MODULE_NAME(aug->aug_pmod));
        ctx->cur_mod = orig_mod;
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
        if (aug->ext) {
            lysc_update_path(ctx, NULL, NULL);
            lysc_update_path(ctx, NULL, NULL);
        }
    }
    if (ctx->augs.count) {
        return LY_ENOTFOUND;
    }

    /* check that all deviations were applied */
    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];
        lysc_update_path(ctx, NULL, "{deviation}");
        lysc_update_path(ctx, NULL, dev->nodeid->str);
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Deviation(s) target node \"%s\" from module \"%s\" was not found.",
                dev->nodeid->str, LYSP_MODULE_NAME(dev->dev_pmods[0]));
        lysc_update_path(ctx, NULL, NULL);
        lysc_update_path(ctx, NULL, NULL);
    }
    if (ctx->devs.count) {
        return LY_ENOTFOUND;
    }

    return LY_SUCCESS;
}